

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

SchnorrKeyPairData * __thiscall
cfd::js::api::json::SchnorrKeyPairData::GetPubkeyString_abi_cxx11_
          (SchnorrKeyPairData *this,SchnorrKeyPairData *obj)

{
  SchnorrKeyPairData *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->pubkey_);
  return this;
}

Assistant:

static std::string GetPubkeyString(  // line separate
      const SchnorrKeyPairData& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.pubkey_);
  }